

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O2

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::filterPoints(Earcut<unsigned_int> *this,Node *start,Node *end)

{
  Node *r;
  bool bVar1;
  double dVar2;
  
  if (end == (Node *)0x0) {
    end = start;
  }
  do {
    if (start->steiner == false) {
      r = start->next;
      if ((start->x != r->x) || (NAN(start->x) || NAN(r->x))) {
LAB_002c8bfc:
        dVar2 = area(this,start->prev,start,r);
        if ((dVar2 != 0.0) || (NAN(dVar2))) goto LAB_002c8bd2;
      }
      else if ((start->y != r->y) || (NAN(start->y) || NAN(r->y))) goto LAB_002c8bfc;
      removeNode(this,start);
      end = start->prev;
      bVar1 = true;
      start = end;
      if (end == end->next) {
        return end;
      }
    }
    else {
LAB_002c8bd2:
      bVar1 = false;
      start = start->next;
    }
    if ((!bVar1) && (start == end)) {
      return end;
    }
  } while( true );
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::filterPoints(Node* start, Node* end) {
    if (!end) end = start;

    Node* p = start;
    bool again;
    do {
        again = false;

        if (!p->steiner && (equals(p, p->next) || area(p->prev, p, p->next) == 0)) {
            removeNode(p);
            p = end = p->prev;

            if (p == p->next) break;
            again = true;

        } else {
            p = p->next;
        }
    } while (again || p != end);

    return end;
}